

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# smtp.c
# Opt level: O0

CURLcode smtp_perform_starttls(Curl_easy *data,connectdata *conn)

{
  CURLcode CVar1;
  CURLcode result;
  connectdata *conn_local;
  Curl_easy *data_local;
  
  CVar1 = Curl_pp_sendf(data,&(conn->proto).ftpc.pp,"%s","STARTTLS");
  if (CVar1 == CURLE_OK) {
    smtp_state(data,SMTP_STARTTLS);
  }
  return CVar1;
}

Assistant:

static CURLcode smtp_perform_starttls(struct Curl_easy *data,
                                      struct connectdata *conn)
{
  /* Send the STARTTLS command */
  CURLcode result = Curl_pp_sendf(data, &conn->proto.smtpc.pp,
                                  "%s", "STARTTLS");

  if(!result)
    smtp_state(data, SMTP_STARTTLS);

  return result;
}